

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

void __thiscall CLayer::GetAdjGrid(CLayer *this)

{
  CDesign *pCVar1;
  CGrid *this_00;
  int iX;
  int iY;
  
  iX = 0;
  pCVar1 = CObject::m_pDesign;
  do {
    if ((int)(pCVar1->super_CBBox).m_iMaxX - (int)(pCVar1->super_CBBox).m_iMinX <= iX) {
      return;
    }
    for (iY = 0; iY < (int)(pCVar1->super_CBBox).m_iMaxY - (int)(pCVar1->super_CBBox).m_iMinY;
        iY = iY + 1) {
      this_00 = GetGrid(this,iX,iY);
      if (this_00 == (CGrid *)0x0) {
        __assert_fail("GetGrid(i,j)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                      ,0x192,"void CLayer::GetAdjGrid()");
      }
      CGrid::GetAdjGrid(this_00,0);
      pCVar1 = CObject::m_pDesign;
    }
    iX = iX + 1;
  } while( true );
}

Assistant:

void CLayer::GetAdjGrid()
{
	for (int i=0;i<GetDesign()->W();++i)
		for (int j=0;j<GetDesign()->H();++j)
		{
			assert(GetGrid(i,j));
			GetGrid(i,j)->GetAdjGrid(0);
		}
}